

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bus.h
# Opt level: O1

void __thiscall Bus::Bus(Bus *this)

{
  m6502::m6502(&this->cpu);
  m2C02::m2C02(&this->ppu);
  (this->cart).super___shared_ptr<Catridge,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->cart).super___shared_ptr<Catridge,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  memset(&this->cpuRam,0,0x804);
  std::__uniq_ptr_impl<Bus,_std::default_delete<Bus>_>::reset
            ((__uniq_ptr_impl<Bus,_std::default_delete<Bus>_> *)&(this->cpu).bus,this);
  return;
}

Assistant:

Bus()
  {
    cpuRam.fill(0);
    cpu.ConnectBus(this);
  }